

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::count(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,key_type *key)

{
  Node *pNVar1;
  size_t sVar2;
  
  pNVar1 = this->mKeyVals;
  sVar2 = Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)this,key);
  return (ulong)(pNVar1 + sVar2 != (Node *)this->mInfo);
}

Assistant:

size_t count(const key_type& key) const { // NOLINT(modernize-use-nodiscard)
        ROBIN_HOOD_TRACE(this)
        auto kv = mKeyVals + findIdx(key);
        if (kv != reinterpret_cast_no_cast_align_warning<Node*>(mInfo)) {
            return 1;
        }
        return 0;
    }